

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeView.cc
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
NodeView::get_mappings_tags
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          NodeView *this,string *datastore_name,int min_read_count)

{
  long lVar1;
  pointer pvVar2;
  pointer pRVar3;
  size_t readID;
  iterator __position;
  LinkedReadsDatastore *pLVar4;
  mapped_type_conflict *pmVar5;
  _Rb_tree_node_base *p_Var6;
  long lVar7;
  pointer pRVar8;
  LinkedTag t;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  tag_counts;
  LinkedTag local_64;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  pLVar4 = WorkSpace::get_linked_reads_datastore(this->dg->sdg->ws,datastore_name);
  lVar1 = this->id;
  lVar7 = -lVar1;
  if (0 < lVar1) {
    lVar7 = lVar1;
  }
  pvVar2 = (pLVar4->mapper).reads_in_node.
           super__Vector_base<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar3 = *(pointer *)
            ((long)&pvVar2[lVar7].super__Vector_base<ReadMapping,_std::allocator<ReadMapping>_>.
                    _M_impl.super__Vector_impl_data + 8);
  for (pRVar8 = pvVar2[lVar7].super__Vector_base<ReadMapping,_std::allocator<ReadMapping>_>._M_impl.
                super__Vector_impl_data._M_start; pRVar8 != pRVar3; pRVar8 = pRVar8 + 1) {
    readID = pRVar8->read_id;
    pLVar4 = WorkSpace::get_linked_reads_datastore(this->dg->sdg->ws,datastore_name);
    local_64 = LinkedReadsDatastore::get_read_tag(pLVar4,readID);
    pmVar5 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           *)&local_60,&local_64);
    *pmVar5 = *pmVar5 + 1;
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &local_60._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    if ((uint)min_read_count < *(uint *)&p_Var6[1].field_0x4) {
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                   __position,&p_Var6[1]._M_color);
      }
      else {
        *__position._M_current = p_Var6[1]._M_color;
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<LinkedTag> NodeView::get_mappings_tags(std::string datastore_name, int min_read_count) const {

    std::map<LinkedTag, uint32_t> tag_counts;
    for (auto mapping: dg->sdg.ws.get_linked_reads_datastore(datastore_name).mapper.reads_in_node[llabs(id)]){
        auto t = dg->sdg.ws.get_linked_reads_datastore(datastore_name).get_read_tag(mapping.read_id);
        tag_counts[t]++;
    }

    std::vector<LinkedTag> tags;
    for (auto &t: tag_counts) {
        if (t.second > min_read_count) {
            tags.push_back(t.first);
        }
    }
    return tags;
}